

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

MOJOSHADER_glShader *
MOJOSHADER_glCompileShader
          (uchar *tokenbuf,uint bufsize,MOJOSHADER_swizzle *swiz,uint swizcount,
          MOJOSHADER_samplerMap *smap,uint smapcount)

{
  int iVar1;
  MOJOSHADER_parseData *_data;
  MOJOSHADER_parseData *pd;
  MOJOSHADER_glShader *pMStack_58;
  GLuint shader;
  MOJOSHADER_glShader *retval;
  MOJOSHADER_samplerMap *pMStack_48;
  uint smapcount_local;
  MOJOSHADER_samplerMap *smap_local;
  MOJOSHADER_swizzle *pMStack_38;
  uint swizcount_local;
  MOJOSHADER_swizzle *swiz_local;
  uchar *puStack_28;
  uint bufsize_local;
  uchar *tokenbuf_local;
  
  pMStack_58 = (MOJOSHADER_glShader *)0x0;
  pd._4_4_ = 0;
  retval._4_4_ = smapcount;
  pMStack_48 = smap;
  smap_local._4_4_ = swizcount;
  pMStack_38 = swiz;
  swiz_local._4_4_ = bufsize;
  puStack_28 = tokenbuf;
  _data = MOJOSHADER_parse(ctx->profile,(char *)0x0,tokenbuf,bufsize,swiz,swizcount,smap,smapcount,
                           ctx->malloc_fn,ctx->free_fn,ctx->malloc_data);
  if (_data->error_count < 1) {
    pMStack_58 = (MOJOSHADER_glShader *)Malloc(0x10);
    if ((pMStack_58 != (MOJOSHADER_glShader *)0x0) &&
       (iVar1 = (*ctx->profileCompileShader)(_data,(GLuint *)((long)&pd + 4)), iVar1 != 0)) {
      pMStack_58->parseData = _data;
      pMStack_58->handle = pd._4_4_;
      pMStack_58->refcount = 1;
      return pMStack_58;
    }
  }
  else {
    set_error(_data->errors->error);
  }
  MOJOSHADER_freeParseData(_data);
  Free(pMStack_58);
  if (pd._4_4_ != 0) {
    (*ctx->profileDeleteShader)(pd._4_4_);
  }
  return (MOJOSHADER_glShader *)0x0;
}

Assistant:

MOJOSHADER_glShader *MOJOSHADER_glCompileShader(const unsigned char *tokenbuf,
                                                const unsigned int bufsize,
                                                const MOJOSHADER_swizzle *swiz,
                                                const unsigned int swizcount,
                                                const MOJOSHADER_samplerMap *smap,
                                                const unsigned int smapcount)
{
    MOJOSHADER_glShader *retval = NULL;
    GLuint shader = 0;

    // This doesn't need a mainfn, since there's no GL lang that does.
    const MOJOSHADER_parseData *pd = MOJOSHADER_parse(ctx->profile, NULL,
                                                      tokenbuf, bufsize,
                                                      swiz, swizcount,
                                                      smap, smapcount,
                                                      ctx->malloc_fn,
                                                      ctx->free_fn,
                                                      ctx->malloc_data);
    if (pd->error_count > 0)
    {
        // !!! FIXME: put multiple errors in the buffer? Don't use
        // !!! FIXME:  MOJOSHADER_glGetError() for this?
        set_error(pd->errors[0].error);
        goto compile_shader_fail;
    } // if

    retval = (MOJOSHADER_glShader *) Malloc(sizeof (MOJOSHADER_glShader));
    if (retval == NULL)
        goto compile_shader_fail;

    if (!ctx->profileCompileShader(pd, &shader))
        goto compile_shader_fail;

    retval->parseData = pd;
    retval->handle = shader;
    retval->refcount = 1;
    return retval;

compile_shader_fail:
    MOJOSHADER_freeParseData(pd);
    Free(retval);
    if (shader != 0)
        ctx->profileDeleteShader(shader);
    return NULL;
}